

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O0

bool __thiscall cmParseMumpsCoverage::ReadCoverageFile(cmParseMumpsCoverage *this,char *file)

{
  cmCTest *this_00;
  byte bVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_458 [32];
  undefined1 local_438 [8];
  ostringstream cmCTestLog_msg;
  string local_2c0 [8];
  string path;
  string type;
  string packages;
  size_type pos;
  string line;
  long local_228;
  ifstream in;
  char *file_local;
  cmParseMumpsCoverage *this_local;
  
  std::ifstream::ifstream(&local_228,file,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&pos);
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,(string *)&pos,(bool *)0x0,-1), bVar2) {
      lVar3 = std::__cxx11::string::find((char)&pos,0x3a);
      std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)((long)&path.field_2 + 8),(ulong)&pos);
        std::__cxx11::string::substr((ulong)local_2c0,(ulong)&pos);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&path.field_2 + 8),"packages");
        if (bVar2) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          LoadPackages(this,pcVar6);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&path.field_2 + 8),"coverage_dir");
          if (bVar2) {
            uVar4 = std::__cxx11::string::c_str();
            (*this->_vptr_cmParseMumpsCoverage[2])(this,uVar4);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
            poVar5 = std::operator<<((ostream *)local_438,"Parse Error in Mumps coverage file :\n");
            poVar5 = std::operator<<(poVar5,file);
            poVar5 = std::operator<<(poVar5,"\ntype: [");
            poVar5 = std::operator<<(poVar5,(string *)(path.field_2._M_local_buf + 8));
            poVar5 = std::operator<<(poVar5,"]\npath:[");
            poVar5 = std::operator<<(poVar5,local_2c0);
            poVar5 = std::operator<<(poVar5,"]\ninput line: [");
            poVar5 = std::operator<<(poVar5,(string *)&pos);
            std::operator<<(poVar5,"]\n");
            this_00 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(this_00,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseMumpsCoverage.cxx"
                         ,0x37,pcVar6,false);
            std::__cxx11::string::~string(local_458);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          }
        }
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
    }
    this_local._7_1_ = true;
    line.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&pos);
  }
  else {
    this_local._7_1_ = false;
    line.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool cmParseMumpsCoverage::ReadCoverageFile(const char* file)
{
  // Read the gtm_coverage.mcov file, that has two lines of data:
  // packages:/full/path/to/Vista/Packages
  // coverage_dir:/full/path/to/dir/with/*.mcov
  cmsys::ifstream in(file);
  if(!in)
    {
    return false;
    }
  std::string line;
  while(cmSystemTools::GetLineFromStream(in, line))
    {
    std::string::size_type pos = line.find(':', 0);
    std::string packages;
    if(pos != std::string::npos)
      {
      std::string type = line.substr(0, pos);
      std::string path = line.substr(pos+1);
      if(type == "packages")
        {
        this->LoadPackages(path.c_str());
        }
      else if(type == "coverage_dir")
        {
        this->LoadCoverageData(path.c_str());
        }
      else
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Parse Error in Mumps coverage file :\n"
                   << file <<
                   "\ntype: [" << type << "]\npath:[" << path << "]\n"
                   "input line: [" << line << "]\n");
        }
      }
    }
  return true;
}